

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

RegNum __thiscall LinearScan::SecondChanceAllocation(LinearScan *this,Lifetime *lifetime,bool force)

{
  RegNum RVar1;
  uint32 uVar2;
  code *pcVar3;
  bool bVar4;
  RegNum reg;
  uint sourceContextId;
  uint functionId;
  BOOL BVar5;
  uint32 uVar6;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  undefined4 *puVar7;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar4 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015bbe90,SecondChancePhase,sourceContextId,functionId);
  if ((!bVar4) && (BVar5 = Func::HasTry(this->func), BVar5 == 0)) {
    if ((*(ushort *)&lifetime->field_0x9c & 0x108) != 0) {
      return RegNOREG;
    }
    if (this->currentOpHelperBlock != (OpHelperBlock *)0x0) {
      return RegNOREG;
    }
    if ((*(ushort *)&lifetime->field_0x9c & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x1133,"(lifetime->isSpilled)","lifetime->isSpilled");
      if (!bVar4) goto LAB_0058a9c4;
      *puVar7 = 0;
    }
    bVar4 = StackSym::IsConst(lifetime->sym);
    if ((!bVar4) && ((lifetime->sym->field_0x19 & 0x10) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x1134,"(lifetime->sym->IsConst() || lifetime->sym->IsAllocated())",
                         "lifetime->sym->IsConst() || lifetime->sym->IsAllocated()");
      if (!bVar4) {
LAB_0058a9c4:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    RVar1 = lifetime->reg;
    uVar2 = lifetime->start;
    uVar6 = IR::Instr::GetNumber(this->currentInstr);
    if (((uVar2 != uVar6) &&
        (uVar2 = lifetime->end, uVar6 = IR::Instr::GetNumber(this->currentInstr), uVar2 != uVar6))
       && (bVar4 = StackSym::IsConst(lifetime->sym), !bVar4)) {
      lifetime->reg = RegNOREG;
      lifetime->field_0x9d = lifetime->field_0x9d | 2;
      reg = FindReg(this,lifetime,(RegOpnd *)0x0,force);
      lifetime->reg = RVar1;
      if (reg != RegNOREG) {
        SecondChanceAllocateToReg(this,lifetime,reg);
        return reg;
      }
      lifetime->field_0x9d = lifetime->field_0x9d & 0xfd;
      return RegNOREG;
    }
  }
  return RegNOREG;
}

Assistant:

RegNum
LinearScan::SecondChanceAllocation(Lifetime *lifetime, bool force)
{
    if (PHASE_OFF(Js::SecondChancePhase, this->func) || this->func->HasTry())
    {
        return RegNOREG;
    }

    // Don't start a second chance allocation from a helper block
    if (lifetime->dontAllocate || this->IsInHelperBlock() || lifetime->isDeadStore)
    {
        return RegNOREG;
    }

    Assert(lifetime->isSpilled);
    Assert(lifetime->sym->IsConst() || lifetime->sym->IsAllocated());

    RegNum oldReg = lifetime->reg;
    RegNum reg;

    if (lifetime->start == this->currentInstr->GetNumber() || lifetime->end == this->currentInstr->GetNumber())
    {
        // No point doing second chance if the lifetime ends here, or starts here (normal allocation would
        // have found a register if one is available).
        return RegNOREG;
    }
    if (lifetime->sym->IsConst())
    {
        // Can't second-chance allocate because we might have deleted the initial def instr, after
        //         having set the reg content on a forward branch...
        return RegNOREG;
    }

    lifetime->reg = RegNOREG;
    lifetime->isSecondChanceAllocated = true;
    reg = this->FindReg(lifetime, nullptr, force);
    lifetime->reg = oldReg;

    if (reg == RegNOREG)
    {
        lifetime->isSecondChanceAllocated = false;
        return reg;
    }

    // Success!! We're re-allocating this lifetime...

    this->SecondChanceAllocateToReg(lifetime, reg);

    return reg;
}